

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O0

Vec_Int_t * Saig_ManCbaPerform(Aig_Man_t *pAbs,int nInputs,Saig_ParBmc_t *pPars)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  abctime aVar4;
  abctime aVar5;
  abctime clk;
  int RetValue;
  Vec_Int_t *vAbsFfsToAdd;
  Saig_ParBmc_t *pPars_local;
  int nInputs_local;
  Aig_Man_t *pAbs_local;
  
  aVar4 = Abc_Clock();
  iVar1 = Saig_ManBmcScalable(pAbs,pPars);
  if (iVar1 == -1) {
    printf("Resource limit is reached during BMC.\n");
    if (pAbs->pSeqModel != (Abc_Cex_t *)0x0) {
      __assert_fail("pAbs->pSeqModel == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absOldCex.c"
                    ,0x349,"Vec_Int_t *Saig_ManCbaPerform(Aig_Man_t *, int, Saig_ParBmc_t *)");
    }
    pAbs_local = (Aig_Man_t *)Vec_IntAlloc(0);
  }
  else if (pAbs->pSeqModel == (Abc_Cex_t *)0x0) {
    printf("BMC did not detect a CEX with the given depth.\n");
    pAbs_local = (Aig_Man_t *)Vec_IntAlloc(0);
  }
  else {
    if (pPars->fVerbose != 0) {
      Abc_CexPrintStats(pAbs->pSeqModel);
    }
    pAbs_local = (Aig_Man_t *)Saig_ManCbaFilterInputs(pAbs,nInputs,pAbs->pSeqModel,pPars->fVerbose);
    iVar1 = Vec_IntSize((Vec_Int_t *)pAbs_local);
    if (iVar1 == 0) {
      Vec_IntFree((Vec_Int_t *)pAbs_local);
      pAbs_local = (Aig_Man_t *)0x0;
    }
    else if (pPars->fVerbose != 0) {
      uVar2 = Vec_IntSize((Vec_Int_t *)pAbs_local);
      iVar1 = Aig_ManRegNum(pAbs);
      iVar3 = Vec_IntSize((Vec_Int_t *)pAbs_local);
      printf("Adding %d registers to the abstraction (total = %d).  ",(ulong)uVar2,
             (ulong)(uint)(iVar1 + iVar3));
      aVar5 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar5 - aVar4);
    }
  }
  return (Vec_Int_t *)pAbs_local;
}

Assistant:

Vec_Int_t * Saig_ManCbaPerform( Aig_Man_t * pAbs, int nInputs, Saig_ParBmc_t * pPars )
{
    Vec_Int_t * vAbsFfsToAdd;
    int RetValue;
    abctime clk = Abc_Clock();
//    assert( pAbs->nRegs > 0 );
    // perform BMC
    RetValue = Saig_ManBmcScalable( pAbs, pPars );
    if ( RetValue == -1 ) // time out - nothing to add
    {
        printf( "Resource limit is reached during BMC.\n" );
        assert( pAbs->pSeqModel == NULL );
        return Vec_IntAlloc( 0 );
    }
    if ( pAbs->pSeqModel == NULL )
    {
        printf( "BMC did not detect a CEX with the given depth.\n" );
        return Vec_IntAlloc( 0 );
    }
    if ( pPars->fVerbose )
        Abc_CexPrintStats( pAbs->pSeqModel );
    // CEX is detected - refine the flops
    vAbsFfsToAdd = Saig_ManCbaFilterInputs( pAbs, nInputs, pAbs->pSeqModel, pPars->fVerbose );
    if ( Vec_IntSize(vAbsFfsToAdd) == 0 )
    {
        Vec_IntFree( vAbsFfsToAdd );
        return NULL;
    }
    if ( pPars->fVerbose )
    {
        printf( "Adding %d registers to the abstraction (total = %d).  ", 
            Vec_IntSize(vAbsFfsToAdd), Aig_ManRegNum(pAbs)+Vec_IntSize(vAbsFfsToAdd) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    return vAbsFfsToAdd;
}